

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall pstore::command_line::literal::~literal(literal *this)

{
  std::__cxx11::string::~string((string *)&this->description);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

literal () = default;